

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpConnection.c
# Opt level: O0

void sbfTcpConnectionErrorQueueCb(sbfQueueItem item,void *closure)

{
  int iVar1;
  undefined8 *in_RSI;
  sbfTcpConnection_conflict tc;
  
  sbfLog_log(*in_RSI,0,"TCP connection %p %s error",in_RSI,(long)in_RSI + 0x22);
  if ((in_RSI[0x14] != 0) && (*(int *)(in_RSI + 0x18) == 0)) {
    (*(code *)in_RSI[0x14])(in_RSI,in_RSI[0x15]);
  }
  iVar1 = sbfRefCount_decrement((sbfRefCount *)((long)in_RSI + 0xc4));
  if (iVar1 != 0) {
    free(in_RSI);
  }
  return;
}

Assistant:

static void
sbfTcpConnectionErrorQueueCb (sbfQueueItem item, void* closure)
{
    sbfTcpConnection tc = closure;

#ifndef WIN32
        sbfLog_debug (tc->mLog,
                      "TCP connection %p %s error",
                      tc,
                      tc->mPeer.sun.sun_path);
#else
        char             tmp[INET_ADDRSTRLEN];

        inet_ntop (AF_INET, &tc->mPeer.sin.sin_addr, tmp, sizeof tmp);
        sbfLog_debug (tc->mLog,
                      "TCP connection %p (%s:%hu) error",
                      tc,
                      tmp,
                      ntohs (tc->mPeer.sin.sin_port));
#endif

    if (tc->mErrorCb != NULL && !tc->mDestroyed)
        tc->mErrorCb (tc, tc->mClosure);

    if (sbfRefCount_decrement (&tc->mRefCount))
        free (tc);
}